

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O1

void __thiscall QSqlField::setTableName(QSqlField *this,QString *tableName)

{
  QSqlFieldPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QSqlFieldPrivate *)0x0) &&
     ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper(&this->d);
  }
  QString::operator=(&((this->d).d.ptr)->table,tableName);
  return;
}

Assistant:

void QSqlField::setTableName(const QString &tableName)
{
    detach();
    d->table = tableName;
}